

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O3

void __thiscall Json::Reader::skipSpaces(Reader *this)

{
  byte *pbVar1;
  
  pbVar1 = (byte *)this->current_;
  while (((pbVar1 != (byte *)this->end_ && ((ulong)*pbVar1 < 0x21)) &&
         ((0x100002600U >> ((ulong)*pbVar1 & 0x3f) & 1) != 0))) {
    pbVar1 = pbVar1 + 1;
    this->current_ = (Location)pbVar1;
  }
  return;
}

Assistant:

void 
Reader::skipSpaces()
{
   while ( current_ != end_ )
   {
      Char c = *current_;
      if ( c == ' '  ||  c == '\t'  ||  c == '\r'  ||  c == '\n' )
         ++current_;
      else
         break;
   }
}